

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapepiramHdiv.cpp
# Opt level: O2

void pzshape::TPZShapePiramHdiv::Shape
               (TPZVec<double> *pt,TPZVec<long> *id,TPZVec<int> *order,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *dphi)

{
  long lVar1;
  double dVar2;
  uint uVar3;
  int iVar4;
  double *pdVar5;
  ulong uVar6;
  int d;
  long lVar7;
  long row;
  int iVar8;
  int shape;
  ulong uVar9;
  ulong uVar10;
  double dVar11;
  int local_440;
  int local_43c;
  double local_410;
  TPZFNMatrix<20,_double> phicp;
  TPZFNMatrix<60,_double> dphicp;
  
  dVar11 = pt->fStore[2];
  local_410 = 0.0;
  if (ABS(dVar11 + -1.0) < 1e-12) {
    pt->fStore[2] = dVar11 + -1e-08;
    local_410 = dVar11;
  }
  TPZFNMatrix<20,_double>::TPZFNMatrix(&phicp,phi);
  TPZFNMatrix<60,_double>::TPZFNMatrix(&dphicp,dphi);
  TPZShapePiram::Shape(pt,id,order,&phicp.super_TPZFMatrix<double>,&dphicp.super_TPZFMatrix<double>)
  ;
  dVar11 = 1.0 / (1.0 - pt->fStore[2]);
  uVar10 = 0;
  iVar4 = 0;
  local_440 = 0;
  do {
    if (uVar10 == 4) {
      local_440 = local_440 + 1;
    }
    else {
      if (uVar10 == 0x13) {
        if (ABS(local_410 + -1.0) < 1e-12) {
          pt->fStore[2] = local_410;
        }
        TPZFNMatrix<60,_double>::~TPZFNMatrix(&dphicp);
        TPZFNMatrix<20,_double>::~TPZFNMatrix(&phicp);
        return;
      }
      uVar9 = 1;
      local_43c = 2;
      if (4 < uVar10) {
        uVar3 = TPZShapePiram::NConnectShapeF((int)uVar10,order->fStore[uVar10 - 5]);
        uVar9 = (ulong)uVar3;
        local_43c = NConnectShapeF((int)uVar10,order->fStore[uVar10 - 5]);
      }
      iVar8 = (int)uVar9;
      uVar6 = 0;
      if (0 < iVar8) {
        uVar6 = uVar9;
      }
      for (uVar9 = 0; uVar9 != uVar6; uVar9 = uVar9 + 1) {
        lVar1 = uVar9 + (long)local_440;
        pdVar5 = TPZFMatrix<double>::operator()(&phicp.super_TPZFMatrix<double>,lVar1,0);
        dVar2 = *pdVar5;
        pdVar5 = TPZFMatrix<double>::operator()(phi,uVar9 + (long)iVar4,0);
        *pdVar5 = dVar2;
        for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
          pdVar5 = TPZFMatrix<double>::operator()(&dphicp.super_TPZFMatrix<double>,lVar7,lVar1);
          dVar2 = *pdVar5;
          pdVar5 = TPZFMatrix<double>::operator()(dphi,lVar7,uVar9 + (long)iVar4);
          *pdVar5 = dVar2;
        }
      }
      if (iVar8 * 2 == local_43c) {
        for (uVar9 = 0; uVar9 != uVar6; uVar9 = uVar9 + 1) {
          lVar1 = uVar9 + (long)local_440;
          pdVar5 = TPZFMatrix<double>::operator()(&phicp.super_TPZFMatrix<double>,lVar1,0);
          dVar2 = *pdVar5;
          lVar7 = (long)(iVar4 + iVar8 + (int)uVar9);
          pdVar5 = TPZFMatrix<double>::operator()(phi,lVar7,0);
          *pdVar5 = dVar2 * dVar11;
          for (row = 0; row != 3; row = row + 1) {
            pdVar5 = TPZFMatrix<double>::operator()(&dphicp.super_TPZFMatrix<double>,row,lVar1);
            dVar2 = *pdVar5;
            pdVar5 = TPZFMatrix<double>::operator()(dphi,row,lVar7);
            *pdVar5 = dVar2 * dVar11;
          }
          pdVar5 = TPZFMatrix<double>::operator()(&phicp.super_TPZFMatrix<double>,lVar1,0);
          dVar2 = *pdVar5;
          pdVar5 = TPZFMatrix<double>::operator()(dphi,2,lVar7);
          *pdVar5 = dVar2 * dVar11 * dVar11 + *pdVar5;
        }
      }
      local_440 = iVar8 + local_440;
      iVar4 = iVar4 + local_43c;
    }
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

void TPZShapePiramHdiv::Shape(TPZVec<REAL> &pt, TPZVec<int64_t> &id, TPZVec<int> &order, TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi) {
        
        REAL temp = 0.;
        if (IsZero(pt[2] - 1.)){
            temp = pt[2];
            pt[2] -= 1.e-8;
        }
        
        TPZFNMatrix<20,REAL> phicp(phi);
        TPZFNMatrix<60,REAL> dphicp(dphi);
        
        TPZShapePiram::Shape(pt, id, order, phicp, dphicp);
        
        REAL zst = 1./(1.-pt[2]);
        int count = 0;
        int countorig = 0;
        for (int is=0; is<NSides; is++) {
            if (is == 4) {
                countorig++;
                continue;
            }
            int norig = 1;
            int nshape = 2;
            if (is>4)
            {
                norig = TPZShapePiram::NConnectShapeF(is, order[is-5]);
                nshape = NConnectShapeF(is, order[is-5]);
            }
            for (int shape = 0; shape<norig; shape++)
            {
                phi(shape+count,0) = phicp(shape+countorig,0);
                for (int d=0; d<3; d++) {
                    dphi(d,shape+count) = dphicp(d,shape+countorig);
                }
            }
            if(norig*2 == nshape)
            {
                for (int shape = 0; shape<norig; shape++)
                {
                    phi(shape+norig+count,0) = phicp(shape+countorig,0)*zst;
                    for (int d=0; d<3; d++) {
                        dphi(d,shape+norig+count) = dphicp(d,shape+countorig)*zst;
                    }
                    dphi(2,shape+norig+count) += phicp(shape+countorig,0)*zst*zst;
                }
            }
            countorig+= norig;
            count += nshape;
        }
        if (IsZero(temp - 1.))
        {
            pt[2] = temp;
        }
    }